

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib_Memory.c
# Opt level: O3

void WjTestLib_Free(void *Memory)

{
  if (Memory == (void *)0x0) {
    WjTestLib_Free_cold_2();
  }
  else {
    free(Memory);
    gTotalNumFrees = gTotalNumFrees + 1;
    if (gTotalNumAllocations < gTotalNumFrees) {
      WjTestLib_Free_cold_1();
    }
  }
  return;
}

Assistant:

void
    WjTestLib_Free
    (
        void*       Memory
    )
{
    if( NULL != Memory )
    {
        free( Memory );
        gTotalNumFrees += 1;
        if( gTotalNumFrees > gTotalNumAllocations )
        {
            fprintf( stderr, "***** MEMORY ERROR (MORE FREES THAN ALLOCS) *****\n" );
        }
    }
    else
    {
        fprintf( stderr, "***** MEMORY ERROR (WjTestLib_Free) *****\n" );
    }
}